

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O3

pair<int,_double>
alex::fanout_tree::find_best_fanout_bottom_up<int,int,alex::AlexCompare>
          (undefined8 expected_insert_frac,undefined8 values,uint num_keys,long node,
          undefined4 total_keys,
          vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>
          *used_fanout_tree_nodes,int max_fanout,undefined4 max_data_node_keys,
          undefined1 approximate_model_computation,undefined1 approximate_cost_computation)

{
  double dVar1;
  pointer pFVar2;
  pointer pFVar3;
  FTNode *pFVar4;
  iterator __position;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  __first;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  __last;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  undefined7 uVar14;
  bool *pbVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  FTNode *tree_node;
  FTNode *__args;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  pair<int,_double> pVar30;
  initializer_list<alex::fanout_tree::FTNode> __l;
  uint local_108;
  allocator_type local_101;
  double best_cost;
  int local_f8;
  uint local_f4;
  double local_f0;
  vector<double,_std::allocator<double>_> fanout_costs;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  fanout_tree;
  double cost;
  pointer local_98;
  undefined8 local_90;
  long local_88;
  undefined8 local_80;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> new_level;
  
  local_f0 = (double)CONCAT44(local_f0._4_4_,total_keys);
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  best_cost = *(double *)(node + 0x20) + 20.0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fanout_tree.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8 = max_fanout;
  local_90 = values;
  local_88 = node;
  local_80 = expected_insert_frac;
  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
            ((vector<double,std::allocator<double>> *)&fanout_costs,(iterator)0x0,&best_cost);
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)best_cost;
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)((ulong)num_keys << 0x20);
  __l._M_len = 1;
  __l._M_array = (iterator)&new_level;
  std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::vector
            ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)&cost,
             __l,&local_101);
  std::
  vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>
  ::emplace_back<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>
            ((vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>
              *)&fanout_tree,
             (vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)&cost)
  ;
  local_f4 = num_keys;
  if (cost != 0.0) {
    operator_delete((void *)cost,(long)local_98 - (long)cost);
  }
  local_108 = 0;
  if (1 < local_f8) {
    iVar16 = 2;
    uVar18 = 1;
    local_108 = 0;
    do {
      new_level.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_level.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_level.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      cost = compute_level<int,int,alex::AlexCompare>
                       (local_80,local_90,local_f4,local_88,(ulong)local_f0 & 0xffffffff,&new_level,
                        uVar18,max_data_node_keys,approximate_model_computation,
                        approximate_cost_computation);
      if (fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&fanout_costs,
                   (iterator)
                   fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&cost);
      }
      else {
        *fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = cost;
        fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar17 = (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (((0x10 < uVar17) &&
          (dVar1 = *(double *)
                    ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + (uVar17 - 0x10)),
          dVar1 < *(double *)
                   ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + (uVar17 - 8)))) &&
         (*(double *)
           ((long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + (uVar17 - 0x18)) < dVar1)) {
        if (new_level.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(new_level.
                          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)new_level.
                                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)new_level.
                                super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        break;
      }
      if (cost < best_cost) {
        best_cost = cost;
        local_108 = uVar18;
      }
      std::
      vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
      ::push_back(&fanout_tree,&new_level);
      if (new_level.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(new_level.
                        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)new_level.
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)new_level.
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      iVar16 = iVar16 * 2;
      uVar18 = uVar18 + 1;
    } while (iVar16 <= local_f8);
  }
  pFVar2 = fanout_tree.
           super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(int)local_108].
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar3 = fanout_tree.
           super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(int)local_108].
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar2 != pFVar3) {
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar21 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pbVar15 = &pFVar2[0x3f].use;
    uVar17 = 0;
    auVar27 = vpbroadcastq_avx512f();
    auVar27 = vpsrlq_avx512f(auVar27,6);
    do {
      auVar28 = vpbroadcastq_avx512f();
      auVar29 = vporq_avx512f(auVar28,auVar26);
      uVar5 = vpcmpuq_avx512f(auVar29,auVar27,2);
      if ((uVar5 & 1) != 0) {
        pbVar15[-0x11b8] = true;
      }
      if ((uVar5 & 2) != 0) {
        pbVar15[-0x1170] = true;
      }
      if ((uVar5 & 4) != 0) {
        pbVar15[-0x1128] = true;
      }
      if ((uVar5 & 8) != 0) {
        pbVar15[-0x10e0] = true;
      }
      if ((uVar5 & 0x10) != 0) {
        pbVar15[-0x1098] = true;
      }
      if ((uVar5 & 0x20) != 0) {
        pbVar15[-0x1050] = true;
      }
      if ((uVar5 & 0x40) != 0) {
        pbVar15[-0x1008] = true;
      }
      if ((uVar5 & 0x80) != 0) {
        pbVar15[-0xfc0] = true;
      }
      auVar29 = vporq_avx512f(auVar28,auVar25);
      uVar5 = vpcmpuq_avx512f(auVar29,auVar27,2);
      if ((uVar5 & 1) != 0) {
        pbVar15[-0xf78] = true;
      }
      if ((uVar5 & 2) != 0) {
        pbVar15[-0xf30] = true;
      }
      if ((uVar5 & 4) != 0) {
        pbVar15[-0xee8] = true;
      }
      if ((uVar5 & 8) != 0) {
        pbVar15[-0xea0] = true;
      }
      if ((uVar5 & 0x10) != 0) {
        pbVar15[-0xe58] = true;
      }
      if ((uVar5 & 0x20) != 0) {
        pbVar15[-0xe10] = true;
      }
      if ((uVar5 & 0x40) != 0) {
        pbVar15[-0xdc8] = true;
      }
      if ((uVar5 & 0x80) != 0) {
        pbVar15[-0xd80] = true;
      }
      auVar29 = vporq_avx512f(auVar28,auVar24);
      uVar5 = vpcmpuq_avx512f(auVar29,auVar27,2);
      if ((uVar5 & 1) != 0) {
        pbVar15[-0xd38] = true;
      }
      if ((uVar5 & 2) != 0) {
        pbVar15[-0xcf0] = true;
      }
      if ((uVar5 & 4) != 0) {
        pbVar15[-0xca8] = true;
      }
      if ((uVar5 & 8) != 0) {
        pbVar15[-0xc60] = true;
      }
      if ((uVar5 & 0x10) != 0) {
        pbVar15[-0xc18] = true;
      }
      if ((uVar5 & 0x20) != 0) {
        pbVar15[-0xbd0] = true;
      }
      if ((uVar5 & 0x40) != 0) {
        pbVar15[-0xb88] = true;
      }
      if ((uVar5 & 0x80) != 0) {
        pbVar15[-0xb40] = true;
      }
      auVar29 = vporq_avx512f(auVar28,auVar23);
      uVar5 = vpcmpuq_avx512f(auVar29,auVar27,2);
      if ((uVar5 & 1) != 0) {
        pbVar15[-0xaf8] = true;
      }
      if ((uVar5 & 2) != 0) {
        pbVar15[-0xab0] = true;
      }
      if ((uVar5 & 4) != 0) {
        pbVar15[-0xa68] = true;
      }
      if ((uVar5 & 8) != 0) {
        pbVar15[-0xa20] = true;
      }
      if ((uVar5 & 0x10) != 0) {
        pbVar15[-0x9d8] = true;
      }
      if ((uVar5 & 0x20) != 0) {
        pbVar15[-0x990] = true;
      }
      if ((uVar5 & 0x40) != 0) {
        pbVar15[-0x948] = true;
      }
      if ((uVar5 & 0x80) != 0) {
        pbVar15[-0x900] = true;
      }
      auVar29 = vporq_avx512f(auVar28,auVar22);
      uVar5 = vpcmpuq_avx512f(auVar29,auVar27,2);
      if ((uVar5 & 1) != 0) {
        pbVar15[-0x8b8] = true;
      }
      if ((uVar5 & 2) != 0) {
        pbVar15[-0x870] = true;
      }
      if ((uVar5 & 4) != 0) {
        pbVar15[-0x828] = true;
      }
      if ((uVar5 & 8) != 0) {
        pbVar15[-0x7e0] = true;
      }
      if ((uVar5 & 0x10) != 0) {
        pbVar15[-0x798] = true;
      }
      if ((uVar5 & 0x20) != 0) {
        pbVar15[-0x750] = true;
      }
      if ((uVar5 & 0x40) != 0) {
        pbVar15[-0x708] = true;
      }
      if ((uVar5 & 0x80) != 0) {
        pbVar15[-0x6c0] = true;
      }
      auVar29 = vporq_avx512f(auVar28,auVar21);
      uVar5 = vpcmpuq_avx512f(auVar29,auVar27,2);
      if ((uVar5 & 1) != 0) {
        pbVar15[-0x678] = true;
      }
      if ((uVar5 & 2) != 0) {
        pbVar15[-0x630] = true;
      }
      if ((uVar5 & 4) != 0) {
        pbVar15[-0x5e8] = true;
      }
      if ((uVar5 & 8) != 0) {
        pbVar15[-0x5a0] = true;
      }
      if ((uVar5 & 0x10) != 0) {
        pbVar15[-0x558] = true;
      }
      if ((uVar5 & 0x20) != 0) {
        pbVar15[-0x510] = true;
      }
      if ((uVar5 & 0x40) != 0) {
        pbVar15[-0x4c8] = true;
      }
      if ((uVar5 & 0x80) != 0) {
        pbVar15[-0x480] = true;
      }
      auVar29 = vporq_avx512f(auVar28,auVar20);
      uVar5 = vpcmpuq_avx512f(auVar29,auVar27,2);
      if ((uVar5 & 1) != 0) {
        pbVar15[-0x438] = true;
      }
      if ((uVar5 & 2) != 0) {
        pbVar15[-0x3f0] = true;
      }
      if ((uVar5 & 4) != 0) {
        pbVar15[-0x3a8] = true;
      }
      if ((uVar5 & 8) != 0) {
        pbVar15[-0x360] = true;
      }
      if ((uVar5 & 0x10) != 0) {
        pbVar15[-0x318] = true;
      }
      if ((uVar5 & 0x20) != 0) {
        pbVar15[-0x2d0] = true;
      }
      if ((uVar5 & 0x40) != 0) {
        pbVar15[-0x288] = true;
      }
      if ((uVar5 & 0x80) != 0) {
        pbVar15[-0x240] = true;
      }
      auVar28 = vporq_avx512f(auVar28,auVar19);
      uVar5 = vpcmpuq_avx512f(auVar28,auVar27,2);
      if ((uVar5 & 1) != 0) {
        pbVar15[-0x1f8] = true;
      }
      if ((uVar5 & 2) != 0) {
        pbVar15[-0x1b0] = true;
      }
      if ((uVar5 & 4) != 0) {
        pbVar15[-0x168] = true;
      }
      if ((uVar5 & 8) != 0) {
        pbVar15[-0x120] = true;
      }
      if ((uVar5 & 0x10) != 0) {
        pbVar15[-0xd8] = true;
      }
      if ((uVar5 & 0x20) != 0) {
        pbVar15[-0x90] = true;
      }
      if ((uVar5 & 0x40) != 0) {
        pbVar15[-0x48] = true;
      }
      if ((uVar5 & 0x80) != 0) {
        *pbVar15 = true;
      }
      uVar17 = uVar17 + 0x40;
      pbVar15 = pbVar15 + 0x1200;
    } while (((ulong)((long)pFVar3 + (-0x48 - (long)pFVar2)) / 0x48 + 0x40 & 0xffffffffffffffc0) !=
             uVar17);
  }
  best_cost = merge_nodes_upwards<int,int>
                        (local_108,best_cost,local_f4,local_f0._0_4_,
                         (vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                          *)fanout_tree.
                            super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  uVar18 = (int)((ulong)((long)fanout_tree.
                               super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)fanout_tree.
                              super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 - 1;
  if ((int)local_108 <= (int)uVar18) {
    uVar18 = local_108;
  }
  new_level.
  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(new_level.
                         super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar18);
  if (-1 < (int)uVar18) {
    uVar17 = 0;
    do {
      pFVar4 = fanout_tree.
               super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17].
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = fanout_tree.
                    super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17].
                    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != pFVar4; __args = __args + 1
          ) {
        if (__args->use == true) {
          __position._M_current = *(FTNode **)(used_fanout_tree_nodes + 8);
          if (__position._M_current == *(FTNode **)(used_fanout_tree_nodes + 0x10)) {
            std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>::
            _M_realloc_insert<alex::fanout_tree::FTNode_const&>
                      (used_fanout_tree_nodes,__position,__args);
          }
          else {
            uVar10 = *(undefined4 *)&__args->field_0x44;
            (__position._M_current)->num_keys = __args->num_keys;
            *(undefined4 *)&(__position._M_current)->field_0x44 = uVar10;
            iVar16 = __args->node_id;
            dVar1 = __args->cost;
            iVar11 = __args->left_boundary;
            iVar12 = __args->right_boundary;
            bVar13 = __args->use;
            uVar14 = *(undefined7 *)&__args->field_0x19;
            dVar6 = __args->expected_avg_search_iterations;
            dVar7 = __args->expected_avg_shifts;
            dVar8 = __args->a;
            dVar9 = __args->b;
            (__position._M_current)->level = __args->level;
            (__position._M_current)->node_id = iVar16;
            (__position._M_current)->cost = dVar1;
            (__position._M_current)->left_boundary = iVar11;
            (__position._M_current)->right_boundary = iVar12;
            (__position._M_current)->use = bVar13;
            *(undefined7 *)&(__position._M_current)->field_0x19 = uVar14;
            (__position._M_current)->expected_avg_search_iterations = dVar6;
            (__position._M_current)->expected_avg_shifts = dVar7;
            (__position._M_current)->a = dVar8;
            (__position._M_current)->b = dVar9;
            *(long *)(used_fanout_tree_nodes + 8) = *(long *)(used_fanout_tree_nodes + 8) + 0x48;
          }
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar18 + 1);
  }
  __first._M_current = *(FTNode **)used_fanout_tree_nodes;
  __last._M_current = *(FTNode **)(used_fanout_tree_nodes + 8);
  if (__first._M_current != __last._M_current) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<alex::fanout_tree::FTNode*,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<alex::fanout_tree::collect_used_nodes(std::vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>const&,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&)::_lambda(alex::fanout_tree::FTNode&,alex::fanout_tree::FTNode&)_1_>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT(((long)__last._M_current - (long)__first._M_current >> 3)
                                          * -0x71c71c71c71c71c7) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]ALEX_src_core_alex_fanout_tree_h:51:13)>
                )&new_level);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<alex::fanout_tree::FTNode*,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<alex::fanout_tree::collect_used_nodes(std::vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>const&,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&)::_lambda(alex::fanout_tree::FTNode&,alex::fanout_tree::FTNode&)_1_>>
              (__first,__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]ALEX_src_core_alex_fanout_tree_h:51:13)>
                )&new_level);
  }
  local_f0 = best_cost;
  std::
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ::~vector(&fanout_tree);
  if (fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)fanout_costs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pVar30._4_4_ = 0;
  pVar30.first = local_108;
  pVar30.second = local_f0;
  return pVar30;
}

Assistant:

std::pair<int, double> find_best_fanout_bottom_up(
    const std::pair<T, P> values[], int num_keys, const AlexNode<T, P>* node,
    int total_keys, std::vector<FTNode>& used_fanout_tree_nodes, int max_fanout,
    int max_data_node_keys, double expected_insert_frac = 0,
    bool approximate_model_computation = true,
    bool approximate_cost_computation = false, Compare key_less = Compare()) {
  // Repeatedly add levels to the fanout tree until the overall cost of each
  // level starts to increase
  int best_level = 0;
  double best_cost = node->cost_ + kNodeLookupsWeight;
  std::vector<double> fanout_costs;
  std::vector<std::vector<FTNode>> fanout_tree;
  fanout_costs.push_back(best_cost);
  fanout_tree.push_back(
      {{0, 0, best_cost, 0, num_keys, false, 0, 0, 0, 0, num_keys}});
  for (int fanout = 2, fanout_tree_level = 1; fanout <= max_fanout;
       fanout *= 2, fanout_tree_level++) {
    std::vector<FTNode> new_level;
    double cost = compute_level<T, P, Compare>(
        values, num_keys, node, total_keys, new_level, fanout_tree_level,
        max_data_node_keys, expected_insert_frac, approximate_model_computation,
        approximate_cost_computation, key_less);
    fanout_costs.push_back(cost);
    if (fanout_costs.size() >= 3 &&
        fanout_costs[fanout_costs.size() - 1] >
            fanout_costs[fanout_costs.size() - 2] &&
        fanout_costs[fanout_costs.size() - 2] >
            fanout_costs[fanout_costs.size() - 3]) {
      break;
    }
    if (cost < best_cost) {
      best_cost = cost;
      best_level = fanout_tree_level;
    }
    fanout_tree.push_back(new_level);
  }
  for (FTNode& tree_node : fanout_tree[best_level]) {
    tree_node.use = true;
  }

  // Merge nodes to improve cost
  best_cost = merge_nodes_upwards<T, P>(best_level, best_cost, num_keys,
                                        total_keys, fanout_tree);

  collect_used_nodes(fanout_tree, best_level, used_fanout_tree_nodes);
  return std::make_pair(best_level, best_cost);
}